

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::GLES2SharingThreadedTests::init(GLES2SharingThreadedTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *pTVar1;
  TestCaseGroup *randomTestsServerSync;
  TestCaseGroup *simpleTestsServerSync;
  TestCaseGroup *randomTestsSync;
  TestCaseGroup *simpleTestsSync;
  TestCaseGroup *randomTests;
  TestCaseGroup *simpleTests;
  GLES2SharingThreadedTests *this_local;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"simple","Simple multithreaded tests");
  addSimpleTests((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,false,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"random","Random tests");
  addRandomTests((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,false,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"simple_egl_sync",
             "Simple multithreaded tests with EGL_KHR_fence_sync");
  addSimpleTests((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,true,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"random_egl_sync",
             "Random tests with EGL_KHR_fence_sync");
  addRandomTests((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,true,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"simple_egl_server_sync",
             "Simple multithreaded tests with EGL_KHR_fence_sync and EGL_KHR_wait_sync");
  addSimpleTests((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"random_egl_server_sync",
             "Random tests with EGL_KHR_fence_sync and EGL_KHR_wait_sync");
  addRandomTests((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void GLES2SharingThreadedTests::init (void)
{
	tcu::TestCaseGroup* simpleTests = new TestCaseGroup(m_eglTestCtx, "simple", "Simple multithreaded tests");
	addSimpleTests(m_eglTestCtx, simpleTests, false, false);
	addChild(simpleTests);

	TestCaseGroup* randomTests = new TestCaseGroup(m_eglTestCtx, "random", "Random tests");
	addRandomTests(m_eglTestCtx, randomTests, false, false);
	addChild(randomTests);

	tcu::TestCaseGroup* simpleTestsSync = new TestCaseGroup(m_eglTestCtx, "simple_egl_sync", "Simple multithreaded tests with EGL_KHR_fence_sync");
	addSimpleTests(m_eglTestCtx, simpleTestsSync, true, false);
	addChild(simpleTestsSync);

	TestCaseGroup* randomTestsSync = new TestCaseGroup(m_eglTestCtx, "random_egl_sync", "Random tests with EGL_KHR_fence_sync");
	addRandomTests(m_eglTestCtx, randomTestsSync, true, false);
	addChild(randomTestsSync);

	tcu::TestCaseGroup* simpleTestsServerSync = new TestCaseGroup(m_eglTestCtx, "simple_egl_server_sync", "Simple multithreaded tests with EGL_KHR_fence_sync and EGL_KHR_wait_sync");
	addSimpleTests(m_eglTestCtx, simpleTestsServerSync, true, true);
	addChild(simpleTestsServerSync);

	TestCaseGroup* randomTestsServerSync = new TestCaseGroup(m_eglTestCtx, "random_egl_server_sync", "Random tests with EGL_KHR_fence_sync and EGL_KHR_wait_sync");
	addRandomTests(m_eglTestCtx, randomTestsServerSync, true, true);
	addChild(randomTestsServerSync);
}